

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O1

QString * __thiscall
QCoreApplicationPrivate::appName(QString *__return_storage_ptr__,QCoreApplicationPrivate *this)

{
  char *pcVar1;
  char **ppcVar2;
  QArrayData *data;
  char16_t *pcVar3;
  char *pcVar4;
  QString *in_RCX;
  QString *pQVar5;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  ppcVar2 = this->argv;
  pcVar4 = *ppcVar2;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = strrchr(pcVar4,0x2f);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = *ppcVar2;
    }
    else {
      pcVar4 = pcVar4 + 1;
    }
    if (pcVar4 == (char *)0x0) {
      pQVar5 = (QString *)0x0;
    }
    else {
      pQVar5 = (QString *)0xffffffffffffffff;
      do {
        in_RCX = (QString *)((long)&(pQVar5->d).d + 1);
        pcVar1 = pcVar4 + 1 + (long)pQVar5;
        pQVar5 = in_RCX;
      } while (*pcVar1 != '\0');
    }
    ba.m_data = (storage_type *)in_RCX;
    ba.m_size = (qsizetype)pcVar4;
    QString::fromLocal8Bit(&local_38,pQVar5,ba);
    data = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_38.d.d;
    (__return_storage_ptr__->d).ptr = local_38.d.ptr;
    (__return_storage_ptr__->d).size = local_38.d.size;
    local_38.d.size = 0;
    local_38.d.d = (Data *)data;
    local_38.d.ptr = pcVar3;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCoreApplicationPrivate::appName() const
{
    QString applicationName;
#ifdef Q_OS_DARWIN
    applicationName = infoDictionaryStringProperty(QStringLiteral("CFBundleName"));
#endif
    if (applicationName.isEmpty() && argv[0]) {
        char *p = strrchr(argv[0], '/');
        applicationName = QString::fromLocal8Bit(p ? p + 1 : argv[0]);
    }

    return applicationName;
}